

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  int *piVar1;
  ushort uVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  uint uVar9;
  ImDrawVert *__dest;
  ulong uVar10;
  unsigned_short *__dest_00;
  ImGuiContext *pIVar11;
  ImDrawVert *pIVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  unsigned_short *puVar16;
  long lVar17;
  ImVector<ImDrawVert> local_48;
  ImDrawData *local_38;
  
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (ImDrawVert *)0x0;
  this->TotalVtxCount = 0;
  this->TotalIdxCount = 0;
  iVar8 = this->CmdListsCount;
  if (0 < iVar8) {
    lVar17 = 0;
    local_38 = this;
    do {
      pIVar11 = GImGui;
      pIVar3 = this->CmdLists[lVar17];
      uVar15 = (pIVar3->IdxBuffer).Size;
      if (uVar15 != 0) {
        __dest = local_48.Data;
        uVar14 = local_48.Capacity;
        uVar9 = uVar15;
        if (local_48.Capacity < (int)uVar15) {
          if (local_48.Capacity == 0) {
            uVar14 = 8;
          }
          else {
            uVar14 = local_48.Capacity + local_48.Capacity / 2;
          }
          if ((int)uVar14 <= (int)uVar15) {
            uVar14 = uVar15;
          }
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (ImDrawVert *)(*(pIVar11->IO).MemAllocFn)((long)(int)uVar14 * 0x14);
          pIVar12 = local_48.Data;
          pIVar11 = GImGui;
          if (local_48.Data != (ImDrawVert *)0x0) {
            memcpy(__dest,local_48.Data,(long)local_48.Size * 0x14);
            pIVar11 = GImGui;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar11->IO).MemFreeFn)(pIVar12);
          uVar9 = (pIVar3->IdxBuffer).Size;
        }
        if (0 < (int)uVar9) {
          uVar10 = 0;
          if (0 < (int)uVar15) {
            uVar10 = (ulong)uVar15;
          }
          uVar13 = 0;
          pIVar12 = __dest;
          do {
            uVar2 = (pIVar3->IdxBuffer).Data[uVar13];
            if (((pIVar3->VtxBuffer).Size <= (int)(uint)uVar2) || (uVar10 == uVar13)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                            ,0x353,
                            "value_type &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar4 = (pIVar3->VtxBuffer).Data;
            pIVar12->col = pIVar4[uVar2].col;
            pIVar4 = pIVar4 + uVar2;
            fVar5 = (pIVar4->pos).y;
            fVar6 = (pIVar4->uv).x;
            fVar7 = (pIVar4->uv).y;
            (pIVar12->pos).x = (pIVar4->pos).x;
            (pIVar12->pos).y = fVar5;
            (pIVar12->uv).x = fVar6;
            (pIVar12->uv).y = fVar7;
            uVar13 = uVar13 + 1;
            pIVar12 = pIVar12 + 1;
          } while ((long)uVar13 < (long)(pIVar3->IdxBuffer).Size);
        }
        local_48.Size = (pIVar3->VtxBuffer).Size;
        local_48.Capacity = (pIVar3->VtxBuffer).Capacity;
        (pIVar3->VtxBuffer).Size = uVar15;
        (pIVar3->VtxBuffer).Capacity = uVar14;
        local_48.Data = (pIVar3->VtxBuffer).Data;
        (pIVar3->VtxBuffer).Data = __dest;
        pIVar11 = GImGui;
        if ((pIVar3->IdxBuffer).Capacity < 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest_00 = (unsigned_short *)(*(pIVar11->IO).MemAllocFn)(0);
          puVar16 = (pIVar3->IdxBuffer).Data;
          if (puVar16 == (unsigned_short *)0x0) {
LAB_0014f6ee:
            puVar16 = (unsigned_short *)0x0;
            pIVar11 = GImGui;
          }
          else {
            memcpy(__dest_00,puVar16,(long)(pIVar3->IdxBuffer).Size * 2);
            pIVar11 = GImGui;
            puVar16 = (pIVar3->IdxBuffer).Data;
            if (puVar16 == (unsigned_short *)0x0) goto LAB_0014f6ee;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar11->IO).MemFreeFn)(puVar16);
          (pIVar3->IdxBuffer).Data = __dest_00;
          (pIVar3->IdxBuffer).Capacity = 0;
          uVar15 = (pIVar3->VtxBuffer).Size;
        }
        (pIVar3->IdxBuffer).Size = 0;
        local_38->TotalVtxCount = local_38->TotalVtxCount + uVar15;
        iVar8 = local_38->CmdListsCount;
        this = local_38;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar8);
  }
  ImVector<ImDrawVert>::~ImVector(&local_48);
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}